

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

void __thiscall
toml::
result<std::pair<double,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::cleanup(result<std::pair<double,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *puVar1;
  source_ptr *psVar2;
  
  if (this->is_ok_ == true) {
    detail::region<std::vector<char,_std::allocator<char>_>_>::~region
              (&(this->field_1).succ.value.second);
    return;
  }
  puVar1 = (undefined1 *)(this->field_1).succ.value.first;
  psVar2 = &(this->field_1).succ.value.second.source_;
  if ((source_ptr *)puVar1 != psVar2) {
    operator_delete(puVar1,(ulong)((long)&(((psVar2->
                                            super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr)->
                                          super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                          super__Vector_impl_data._M_start + 1));
    return;
  }
  return;
}

Assistant:

void cleanup() noexcept
    {
        if(this->is_ok_) {this->succ.~success_type();}
        else             {this->fail.~failure_type();}
        return;
    }